

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

long __thiscall
wasm::Random::pickGivenNum<long,unsigned_char,unsigned_short,unsigned_int,unsigned_long>
          (Random *this,size_t num,long first,uchar args,unsigned_short args_1,uint args_2,
          unsigned_long args_3)

{
  uint args_local_2;
  unsigned_short args_local_1;
  uchar args_local;
  long first_local;
  size_t num_local;
  Random *this_local;
  
  this_local = (Random *)first;
  if (num != 0) {
    this_local = (Random *)
                 pickGivenNum<long,unsigned_short,unsigned_int,unsigned_long>
                           (this,num - 1,(ulong)args,args_1,args_2,args_3);
  }
  return (long)this_local;
}

Assistant:

T pickGivenNum(size_t num, T first, Args... args) {
    if (num == 0) {
      return first;
    }
    return pickGivenNum<T>(num - 1, args...);
  }